

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O3

void __thiscall Transaction_GetRwInt_Test::TestBody(Transaction_GetRwInt_Test *this)

{
  TypedExpectation<pstore::address_(unsigned_long,_unsigned_int)> *pTVar1;
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *pTVar2
  ;
  mock_database *this_00;
  Expectation allocate_int;
  mock_mutex mutex;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  MatcherBase<unsigned_long> local_160;
  Expectation local_148;
  MatcherBase<pstore::address> local_138;
  _Any_data local_120;
  code *local_110;
  code *local_108;
  _Any_data local_100;
  code *local_f0;
  code *local_e8;
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> local_d0;
  MatcherBase<bool> local_68;
  MatcherBase<bool> local_50;
  pair<std::shared_ptr<int>,_pstore::typed_address<int>_> local_38;
  
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_120,4);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_138,4);
  this_00 = &(this->super_Transaction).db_;
  anon_unknown.dwarf_40a165::mock_database::gmock_allocate
            ((MockSpec<pstore::address_(unsigned_long,_unsigned_int)> *)&local_d0,this_00,
             (Matcher<unsigned_long> *)&local_120,(Matcher<unsigned_int> *)&local_138);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<pstore::address_(unsigned_long,_unsigned_int)>::
           InternalExpectedAt((MockSpec<pstore::address_(unsigned_long,_unsigned_int)> *)&local_d0,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                              ,0x1b0,"db_","allocate (sizeof (int), alignof (int))");
  local_100._M_unused._M_object = operator_new(0x18);
  *(mock_database **)local_100._M_unused._0_8_ = this_00;
  *(code **)((long)local_100._M_unused._0_8_ + 8) =
       anon_unknown.dwarf_40a165::mock_database::base_allocate;
  *(long *)((long)local_100._M_unused._0_8_ + 0x10) = 0;
  local_100._8_8_ = 0;
  local_f0 = std::
             _Function_handler<pstore::address_(unsigned_long,_unsigned_int),_testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>_>
             ::_M_manager;
  local_e8 = std::
             _Function_handler<pstore::address_(unsigned_long,_unsigned_int),_testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>_>
             ::_M_invoke;
  pTVar1 = testing::internal::TypedExpectation<pstore::address_(unsigned_long,_unsigned_int)>::
           WillOnce(pTVar1,(Action<pstore::address_(unsigned_long,_unsigned_int)> *)&local_100);
  (*(pTVar1->super_ExpectationBase)._vptr_ExpectationBase[3])(&local_160,pTVar1);
  local_148.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_160.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
  local_148.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160.vtable_;
  if (local_160.vtable_ != (VTable *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_160.vtable_)->describe = *(int *)&(local_160.vtable_)->describe + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_160.vtable_)->describe = *(int *)&(local_160.vtable_)->describe + 1;
    }
  }
  testing::Expectation::~Expectation((Expectation *)&local_160);
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,3);
  }
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_d0.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Tuple_impl<2UL,_testing::Matcher<bool>,_testing::Matcher<bool>_>.
              super__Head_base<2UL,_testing::Matcher<bool>,_false>);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)&local_d0.matchers_);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)&local_138);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_120);
  local_138.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::address>::
       GetVTable<testing::internal::MatcherBase<pstore::address>::ValuePolicy<testing::internal::GeMatcher<pstore::address>,true>>()
       ::kVTable;
  local_138.buffer_.d = 8.69555536680594e-322;
  local_138.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0026b818;
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_160,4);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_50,false);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_68,true);
  anon_unknown.dwarf_40a165::mock_database::gmock_get
            (&local_d0,this_00,(Matcher<pstore::address> *)&local_138,
             (Matcher<unsigned_long> *)&local_160,(Matcher<bool> *)&local_50,
             (Matcher<bool> *)&local_68);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::
           MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
           InternalExpectedAt(&local_d0,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                              ,0x1b6,"db_",
                              "get (Ge (pstore::address{pstore::leader_size + sizeof (pstore::trailer)}), sizeof (int), false, true)"
                             );
  testing::ExpectationSet::ExpectationSet((ExpectationSet *)&local_100,&local_148);
  pTVar2 = testing::internal::
           TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
           ::After(pTVar2,(ExpectationSet *)&local_100);
  local_120._M_unused._M_object = operator_new(0x18);
  *(mock_database **)local_120._M_unused._0_8_ = this_00;
  *(code **)((long)local_120._M_unused._0_8_ + 8) =
       anon_unknown.dwarf_40a165::mock_database::base_get;
  *(long *)((long)local_120._M_unused._0_8_ + 0x10) = 0;
  local_120._8_8_ = 0;
  local_110 = std::
              _Function_handler<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool),_testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_std::shared_ptr<const_void>_((anonymous_namespace)::mock_database::*)(const_pstore::address_&,_unsigned_long,_bool,_bool)_const>_>
              ::_M_manager;
  local_108 = std::
              _Function_handler<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool),_testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_std::shared_ptr<const_void>_((anonymous_namespace)::mock_database::*)(const_pstore::address_&,_unsigned_long,_bool,_bool)_const>_>
              ::_M_invoke;
  testing::internal::
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  WillOnce(pTVar2,(Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
                   *)&local_120);
  if (local_110 != (code *)0x0) {
    (*local_110)(&local_120,&local_120,3);
  }
  std::
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
               *)&local_100);
  testing::internal::MatcherBase<pstore::address>::~MatcherBase
            ((MatcherBase<pstore::address> *)
             &local_d0.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Head_base<0UL,_testing::Matcher<pstore::address>,_false>);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_d0.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>);
  testing::internal::MatcherBase<bool>::~MatcherBase
            ((MatcherBase<bool> *)
             &local_d0.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Tuple_impl<2UL,_testing::Matcher<bool>,_testing::Matcher<bool>_>.
              super__Head_base<2UL,_testing::Matcher<bool>,_false>);
  testing::internal::MatcherBase<bool>::~MatcherBase((MatcherBase<bool> *)&local_d0.matchers_);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_68);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_50);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_160);
  testing::internal::MatcherBase<pstore::address>::~MatcherBase(&local_138);
  testing::Expectation::~Expectation(&local_148);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._M_unused._M_object = &local_120;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)&local_100);
  local_100._M_pod_data[8] = 1;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&local_d0,&this_00->super_database,
             (lock_type *)&local_100);
  pstore::transaction_base::alloc_rw<int,void>(&local_38,(transaction_base *)&local_d0,1);
  if (local_38.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  pstore::transaction_base::commit((transaction_base *)&local_d0);
  local_d0.function_mocker_ =
       (FunctionMocker<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *)
       &PTR__transaction_0026b340;
  pstore::transaction_base::rollback((transaction_base *)&local_d0);
  return;
}

Assistant:

TEST_F (Transaction, GetRwInt) {
    // First setup the mock expectations.
    {
        using ::testing::Expectation;
        using ::testing::Ge;
        using ::testing::Invoke;

        Expectation allocate_int = EXPECT_CALL (db_, allocate (sizeof (int), alignof (int)))
                                       .WillOnce (Invoke (&db_, &mock_database::base_allocate));

        // A call to get(). First argument (address) must lie beyond the initial transaction
        // and must request a writable int.
        EXPECT_CALL (db_, get (Ge (pstore::address{pstore::leader_size + sizeof (pstore::trailer)}),
                               sizeof (int), false, true))
            .After (allocate_int)
            .WillOnce (Invoke (&db_, &mock_database::base_get));
    }
    // Now the real body of the test
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        transaction.alloc_rw<int> ();
        transaction.commit ();
    }
}